

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

bool __thiscall
axl::sl::Array<void*,axl::sl::ArrayDetails<void*>>::
setCountImpl<axl::sl::SimpleArrayDetails<void*>::Construct>
          (Array<void_*,_axl::sl::ArrayDetails<void_*>_> *this,size_t count)

{
  bool bVar1;
  size_t sVar2;
  BufHdr *pBVar3;
  BufHdr *pBVar4;
  BufHdr *this_00;
  ulong in_RSI;
  long *in_RDI;
  void **p;
  Ptr<axl::rc::BufHdr> hdr;
  size_t bufferSize;
  bool result;
  size_t size;
  BufHdr *in_stack_ffffffffffffff68;
  BufHdr *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  Construct local_59;
  BufHdr *local_58;
  undefined4 local_50;
  Ptr local_40 [16];
  size_t in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  Construct in_stack_ffffffffffffffdf;
  bool local_1;
  
  if ((in_RDI[1] != 0) && (sVar2 = rc::RefCount::getRefCount((RefCount *)in_RDI[1]), sVar2 == 1)) {
    if (in_RDI[2] == in_RSI) {
      return true;
    }
    if (in_RSI << 3 <= *(ulong *)(in_RDI[1] + 0x18)) {
      if ((ulong)in_RDI[2] < in_RSI) {
        SimpleArrayDetails<void_*>::Construct::operator()
                  ((Construct *)&stack0xffffffffffffffdf,(void **)(*in_RDI + in_RDI[2] * 8),
                   in_RSI - in_RDI[2]);
      }
      else {
        SimpleArrayDetails<void_*>::destruct((void **)(*in_RDI + in_RSI * 8),in_RDI[2] - in_RSI);
      }
      SimpleArrayDetails<void_*>::setHdrCount((Hdr *)in_RDI[1],in_RSI);
      in_RDI[2] = in_RSI;
      return true;
    }
  }
  if (in_RSI == 0) {
    ArrayRef<void_*,_axl::sl::ArrayDetails<void_*>_>::release
              ((ArrayRef<void_*,_axl::sl::ArrayDetails<void_*>_> *)in_stack_ffffffffffffff70);
    local_1 = true;
  }
  else if (in_RDI[2] == 0) {
    bVar1 = Array<void_*,_axl::sl::ArrayDetails<void_*>_>::reserve
                      ((Array<void_*,_axl::sl::ArrayDetails<void_*>_> *)
                       CONCAT17(in_stack_ffffffffffffffdf,
                                CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)),
                       in_stack_ffffffffffffffd0);
    if (bVar1) {
      SimpleArrayDetails<void_*>::Construct::operator()
                ((Construct *)&stack0xffffffffffffffdd,(void **)*in_RDI,in_RSI);
      SimpleArrayDetails<void_*>::setHdrCount((Hdr *)in_RDI[1],in_RSI);
      in_RDI[2] = in_RSI;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    getAllocSize(0x15760e);
    pBVar3 = (BufHdr *)mem::allocate(0x157621);
    rc::BufHdr::BufHdr(pBVar3,in_stack_ffffffffffffff78,(uintptr_t)in_stack_ffffffffffffff70);
    rc::primeRefCount<axl::rc::BufHdr>
              (in_stack_ffffffffffffff70,(FreeFunc *)in_stack_ffffffffffffff68);
    rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>
              ((Ptr<axl::rc::BufHdr> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    pBVar4 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
    if (pBVar4 == (BufHdr *)0x0) {
      local_1 = false;
    }
    else {
      pBVar4 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
      SimpleArrayDetails<void_*>::setHdrCount(pBVar4,in_RSI);
      this_00 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
      local_58 = this_00 + 1;
      if ((ulong)in_RDI[2] < in_RSI) {
        SimpleArrayDetails<void_*>::constructCopy
                  ((void **)this_00,(void **)in_stack_ffffffffffffff68,0x157733);
        SimpleArrayDetails<void_*>::Construct::operator()
                  (&local_59,&(local_58->super_RefCount)._vptr_RefCount + in_RDI[2],
                   in_RSI - in_RDI[2]);
      }
      else {
        SimpleArrayDetails<void_*>::constructCopy
                  ((void **)this_00,(void **)in_stack_ffffffffffffff68,0x157719);
      }
      rc::RefCount::release(&this_00->super_RefCount);
      *in_RDI = (long)local_58;
      pBVar3 = rc::Ptr<axl::rc::BufHdr>::detach((Ptr<axl::rc::BufHdr> *)pBVar3,(RefCount **)pBVar4);
      in_RDI[1] = (long)pBVar3;
      in_RDI[2] = in_RSI;
      local_1 = true;
    }
    local_50 = 1;
    rc::Ptr<axl::rc::BufHdr>::~Ptr((Ptr<axl::rc::BufHdr> *)0x1577c4);
  }
  return local_1;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}